

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rcore.c
# Opt level: O1

char * GetFileNameWithoutExt(char *filePath)

{
  int iVar1;
  char *pcVar2;
  char *pcVar3;
  ulong uVar4;
  char *pcVar5;
  
  memset(GetFileNameWithoutExt::fileName,0,0x100);
  if (filePath != (char *)0x0) {
    pcVar3 = (char *)0x0;
    pcVar5 = filePath;
    do {
      pcVar2 = pcVar3;
      pcVar3 = strpbrk(pcVar5,"\\/");
      pcVar5 = pcVar3 + 1;
    } while (pcVar3 != (char *)0x0);
    pcVar5 = pcVar2 + 1;
    if (pcVar2 == (char *)0x0) {
      pcVar5 = filePath;
    }
    strcpy(GetFileNameWithoutExt::fileName,pcVar5);
    uVar4 = strlen(GetFileNameWithoutExt::fileName);
    if (0 < (int)uVar4) {
      do {
        if (GetFileNameWithoutExt::fileName[uVar4 & 0xffffffff] == '.') {
          GetFileNameWithoutExt::fileName[uVar4 & 0xffffffff] = '\0';
          break;
        }
        iVar1 = (int)uVar4;
        uVar4 = (ulong)(iVar1 - 1);
      } while (1 < iVar1);
    }
  }
  return GetFileNameWithoutExt::fileName;
}

Assistant:

const char *GetFileNameWithoutExt(const char *filePath)
{
    #define MAX_FILENAME_LENGTH     256

    static char fileName[MAX_FILENAME_LENGTH] = { 0 };
    memset(fileName, 0, MAX_FILENAME_LENGTH);

    if (filePath != NULL)
    {
        strcpy(fileName, GetFileName(filePath)); // Get filename.ext without path
        int size = (int)strlen(fileName); // Get size in bytes

        for (int i = size; i > 0; i--) // Reverse search '.'
        {
            if (fileName[i] == '.')
            {
                // NOTE: We break on first '.' found
                fileName[i] = '\0';
                break;
            }
        }
    }

    return fileName;
}